

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O1

BOOL __thiscall
Js::CustomExternalWrapperObject::EnsureInitialized
          (CustomExternalWrapperObject *this,ScriptContext *requestContext)

{
  bool bVar1;
  DynamicObject *aValue;
  ThreadContext *this_00;
  bool bVar2;
  Attributes attributes;
  JavascriptFunction *function;
  JavascriptMethod p_Var3;
  Var pvVar4;
  ImplicitCallFlags IVar5;
  
  if (this->initialized != false) {
    return 1;
  }
  aValue = ((this->super_DynamicObject).super_RecyclableObject.type.ptr[1].propertyCache.ptr)->
           elements[4].prototypeObjectWithProperty.ptr;
  if (aValue == (DynamicObject *)0x0) {
    return 1;
  }
  this_00 = requestContext->threadContext;
  if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_External;
    return 0;
  }
  this->initialized = true;
  function = VarTo<Js::JavascriptFunction>(aValue);
  bVar1 = this_00->reentrancySafeOrHandled;
  this_00->reentrancySafeOrHandled = true;
  attributes = FunctionInfo::GetAttributes((RecyclableObject *)function);
  bVar2 = ThreadContext::HasNoSideEffect(this_00,(RecyclableObject *)function,attributes);
  if (bVar2) {
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
    if (this_00->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var3 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    CheckIsExecutable((RecyclableObject *)function,p_Var3);
    p_Var3 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    pvVar4 = (*p_Var3)((RecyclableObject *)function,(CallInfo)function,0x2000001,0,0,0,0,0x2000001,
                       this);
    bVar2 = ThreadContext::IsOnStack(pvVar4);
LAB_00b3eecb:
    if (bVar2 == false) goto LAB_00b3ef82;
LAB_00b3ef6d:
    IVar5 = this_00->implicitCallFlags;
  }
  else {
    if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag)
    goto LAB_00b3ef6d;
    if ((attributes & HasNoSideEffect) != None) {
      ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
      if (this_00->noJsReentrancy == true) {
        Throw::FatalJsReentrancyError();
      }
      p_Var3 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
      CheckIsExecutable((RecyclableObject *)function,p_Var3);
      p_Var3 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
      pvVar4 = (*p_Var3)((RecyclableObject *)function,(CallInfo)function,0x2000001,0,0,0,0,0x2000001
                         ,this);
      bVar2 = ThreadContext::IsOnStack(pvVar4);
      goto LAB_00b3eecb;
    }
    IVar5 = this_00->implicitCallFlags;
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
    if (this_00->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var3 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    CheckIsExecutable((RecyclableObject *)function,p_Var3);
    p_Var3 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    (*p_Var3)((RecyclableObject *)function,(CallInfo)function,0x2000001,0,0,0,0,0x2000001,this);
  }
  this_00->implicitCallFlags = IVar5 | ImplicitCall_Accessor;
LAB_00b3ef82:
  this_00->reentrancySafeOrHandled = bVar1;
  return 1;
}

Assistant:

BOOL CustomExternalWrapperObject::EnsureInitialized(ScriptContext* requestContext)
{
    ThreadContext* threadContext = requestContext->GetThreadContext();
    if (this->initialized)
    {
        return TRUE;
    }
    void* initializeTrap = this->GetExternalType()->GetJsGetterSetterInterceptor()->initializeTrap;
    if (initializeTrap == nullptr)
    {
        return TRUE;
    }
    if (threadContext->IsDisableImplicitCall())
    {
        threadContext->AddImplicitCallFlags(Js::ImplicitCall_External);
        return FALSE;
    }

    this->initialized = true;
    JavascriptFunction * initializeMethod = Js::VarTo<JavascriptFunction>(initializeTrap);

    Js::RecyclableObject * targetObj = this;
    threadContext->ExecuteImplicitCall(initializeMethod, Js::ImplicitCall_Accessor, [=]()->Js::Var
    {
        return CALL_FUNCTION(threadContext, initializeMethod, Js::CallInfo(Js::CallFlags_Value, 1), targetObj);
    });
    return TRUE;
}